

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O1

int readSIB(InternalInstruction *insn)

{
  uint8_t uVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  byte bVar6;
  int iVar7;
  SIBIndex SVar8;
  
  if (insn->consumedSIB != false) {
    return 0;
  }
  insn->consumedSIB = true;
  uVar1 = insn->addressSize;
  if (uVar1 == '\x02') {
    return -1;
  }
  if (uVar1 == '\b') {
    iVar5 = 0x11;
    iVar7 = 0x21;
  }
  else {
    iVar7 = 0;
    iVar5 = 0;
    if (uVar1 == '\x04') {
      iVar5 = 1;
      iVar7 = 0x11;
    }
  }
  iVar3 = (*insn->reader)((reader_info *)insn->readerArg,&insn->sib,insn->readerCursor);
  if (iVar3 != 0) {
    return -1;
  }
  insn->readerCursor = insn->readerCursor + 1;
  bVar2 = insn->sib;
  bVar6 = insn->rexPrefix * '\x04' & 8 | bVar2 >> 3 & 7;
  if (insn->vectorExtensionType == TYPE_EVEX) {
    bVar6 = (insn->vectorExtensionPrefix[3] * '\x02' & 0x10 | bVar6) ^ 0x10;
  }
  if (bVar6 != 4) {
    SVar8 = iVar7 + (uint)bVar6;
    insn->sibIndex = SVar8;
    if ((SVar8 != SIB_INDEX_sib64) && (SVar8 != SIB_INDEX_sib)) goto LAB_001a6c6a;
  }
  insn->sibIndex = SIB_INDEX_NONE;
LAB_001a6c6a:
  insn->sibScale = (uint8_t)(0x8040201 >> (bVar2 >> 3 & 0x18));
  uVar4 = (uint)(byte)((insn->rexPrefix & 1) << 3 | bVar2 & 7);
  if ((uVar4 | 8) != 0xd) {
    insn->sibBase = iVar5 + uVar4;
    return 0;
  }
  iVar5 = (*(code *)(&DAT_001f35b8 + *(int *)(&DAT_001f35b8 + (ulong)(insn->modRM >> 6) * 4)))();
  return iVar5;
}

Assistant:

static int readSIB(struct InternalInstruction *insn)
{
	SIBIndex sibIndexBase = SIB_INDEX_NONE;
	SIBBase sibBaseBase = SIB_BASE_NONE;
	uint8_t index, base;

	// dbgprintf(insn, "readSIB()");

	if (insn->consumedSIB)
		return 0;

	insn->consumedSIB = true;

	switch (insn->addressSize) {
		case 2:
			// dbgprintf(insn, "SIB-based addressing doesn't work in 16-bit mode");
			return -1;
		case 4:
			sibIndexBase = SIB_INDEX_EAX;
			sibBaseBase = SIB_BASE_EAX;
			break;
		case 8:
			sibIndexBase = SIB_INDEX_RAX;
			sibBaseBase = SIB_BASE_RAX;
			break;
	}

	if (consumeByte(insn, &insn->sib))
		return -1;

	index = indexFromSIB(insn->sib) | (xFromREX(insn->rexPrefix) << 3);
	if (insn->vectorExtensionType == TYPE_EVEX)
		index |= v2FromEVEX4of4(insn->vectorExtensionPrefix[3]) << 4;

	switch (index) {
		case 0x4:
			insn->sibIndex = SIB_INDEX_NONE;
			break;
		default:
			insn->sibIndex = (SIBIndex)(sibIndexBase + index);
			if (insn->sibIndex == SIB_INDEX_sib ||
					insn->sibIndex == SIB_INDEX_sib64)
				insn->sibIndex = SIB_INDEX_NONE;
			break;
	}

	switch (scaleFromSIB(insn->sib)) {
		case 0:
			insn->sibScale = 1;
			break;
		case 1:
			insn->sibScale = 2;
			break;
		case 2:
			insn->sibScale = 4;
			break;
		case 3:
			insn->sibScale = 8;
			break;
	}

	base = baseFromSIB(insn->sib) | (bFromREX(insn->rexPrefix) << 3);

	switch (base) {
		case 0x5:
		case 0xd:
			switch (modFromModRM(insn->modRM)) {
				case 0x0:
					insn->eaDisplacement = EA_DISP_32;
					insn->sibBase = SIB_BASE_NONE;
					break;
				case 0x1:
					insn->eaDisplacement = EA_DISP_8;
					insn->sibBase = (SIBBase)(sibBaseBase + base);
					break;
				case 0x2:
					insn->eaDisplacement = EA_DISP_32;
					insn->sibBase = (SIBBase)(sibBaseBase + base);
					break;
				case 0x3:
					//debug("Cannot have Mod = 0b11 and a SIB byte");
					return -1;
			}
			break;
		default:
			insn->sibBase = (SIBBase)(sibBaseBase + base);
			break;
	}

	return 0;
}